

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpropertyprivate.h
# Opt level: O1

void __thiscall
QPropertyDelayedNotifications::addProperty
          (QPropertyDelayedNotifications *this,QPropertyBindingData *bindingData,
          QUntypedPropertyData *propertyData)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  QPropertyDelayedNotifications *pQVar4;
  QPropertyProxyBindingData *pQVar5;
  QPropertyObserver *observer;
  
  uVar1 = bindingData->d_ptr;
  if ((uVar1 & 2) == 0) {
    for (; lVar2 = this->used, lVar2 == 0xa9; this = this->next) {
      if (this->next == (QPropertyDelayedNotifications *)0x0) {
        pQVar4 = (QPropertyDelayedNotifications *)operator_new(0xff0);
        pQVar4->ref = 0;
        pQVar4->next = (QPropertyDelayedNotifications *)0x0;
        pQVar4->used = 0;
        this->next = pQVar4;
      }
    }
    pQVar5 = this->delayedProperties + lVar2;
    pQVar5->d_ptr = uVar1;
    this->delayedProperties[lVar2].originalBindingData = bindingData;
    this->delayedProperties[lVar2].propertyData = propertyData;
    this->used = lVar2 + 1;
    uVar3 = bindingData->d_ptr;
    bindingData->d_ptr = (ulong)((uint)uVar3 & 1) | (ulong)pQVar5 | 2;
    if (uVar1 != 0 && (uVar3 & 1) == 0) {
      *(QPropertyProxyBindingData **)(uVar1 + 8) = pQVar5;
    }
  }
  return;
}

Assistant:

bool isNotificationDelayed() const { return d_ptr & DelayedNotificationBit; }